

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
_applyScaledBounds<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *solver,Rational *primalScale)

{
  int iVar1;
  uint uVar2;
  type_conflict5 tVar3;
  SPxOut *pSVar4;
  ulong uVar5;
  uint uVar6;
  cpp_dec_float<50U,_int,_void> local_88;
  string local_50;
  
  local_88.data._M_elems[0] = 1;
  tVar3 = boost::multiprecision::operator<(primalScale,(int *)&local_88);
  if (tVar3) {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)primalScale,1);
  }
  local_88.data._M_elems[0] = 1;
  tVar3 = boost::multiprecision::operator>(primalScale,(int *)&local_88);
  if ((tVar3) && (iVar1 = *(int *)(this + 0x10), 3 < iVar1)) {
    *(undefined4 *)(this + 0x10) = 4;
    pSVar4 = soplex::operator<<((SPxOut *)(this + 8),"Scaling primal by ");
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::str_abi_cxx11_(&local_50,
                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                      *)primalScale,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
    pSVar4 = soplex::operator<<(pSVar4,&local_50);
    soplex::operator<<(pSVar4,".\n");
    std::__cxx11::string::~string((string *)&local_50);
    *(int *)(this + 0x10) = iVar1;
  }
  uVar6 = *(uint *)(*(long *)(this + 0x52e0) + 0x100);
  while (0 < (int)uVar6) {
    uVar6 = uVar6 - 1;
    uVar5 = (ulong)uVar6;
    uVar2 = *(uint *)(*(long *)(this + 0x5a60) + uVar5 * 4);
    if (uVar2 < 5) {
      if ((0x1aU >> (uVar2 & 0x1f) & 1) != 0) {
        local_88.data._M_elems[0] = 1;
        tVar3 = boost::multiprecision::operator>(primalScale,(int *)&local_88);
        if (tVar3) {
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)(uVar5 * 0x40 + *(long *)(this + 0x5968)),
                       (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)primalScale);
        }
        tVar3 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)(*(long *)(this + 0x5968) + uVar5 * 0x40),
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)(this + 0x80));
        if (tVar3) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_88,-*(double *)(*(long *)(this + 0x28) + 0xc0),(type *)0x0);
        }
        else {
          local_88.data._M_elems[0] = 1;
          boost::multiprecision::operator>(primalScale,(int *)&local_88);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
          ::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_88,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)(uVar5 * 0x40 + *(long *)(this + 0x5968)),(type *)0x0);
        }
        (*(solver->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2a])(solver,(ulong)uVar6,&local_88,0);
      }
    }
    if (*(int *)(*(long *)(this + 0x5a60) + uVar5 * 4) - 2U < 3) {
      local_88.data._M_elems[0] = 1;
      tVar3 = boost::multiprecision::operator>(primalScale,(int *)&local_88);
      if (tVar3) {
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)(uVar5 * 0x40 + *(long *)(this + 0x5980)),
                     (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)primalScale);
      }
      tVar3 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)(*(long *)(this + 0x5980) + uVar5 * 0x40),
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)(this + 0x40));
      if (tVar3) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_88,*(double *)(*(long *)(this + 0x28) + 0xc0),(type *)0x0);
      }
      else {
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_88,
                   (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                    *)(uVar5 * 0x40 + *(long *)(this + 0x5980)),(type *)0x0);
      }
      (*(solver->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(solver,(ulong)uVar6,&local_88,0);
    }
  }
  return;
}

Assistant:

void SoPlexBase<R>::_applyScaledBounds(SPxSolverBase<T>& solver, Rational& primalScale)
{
   if(primalScale < 1)
      primalScale = 1;

   if(primalScale > 1)
      SPX_MSG_INFO2(spxout, spxout << "Scaling primal by " << primalScale.str() << ".\n");

   for(int c = numColsRational() - 1; c >= 0; c--)
   {
      if(_lowerFinite(_colTypes[c]))
      {
         if(primalScale > 1)
            _modLower[c] *= primalScale;

         if(_modLower[c] <= _rationalNegInfty)
            solver.changeLower(c, -realParam(SoPlexBase<R>::INFTY));
         else if(primalScale > 1)
            solver.changeLower(c, T(_modLower[c]));
         else
            solver.changeLower(c, T(_modLower[c]));
      }

      if(_upperFinite(_colTypes[c]))
      {
         if(primalScale > 1)
            _modUpper[c] *= primalScale;

         if(_modUpper[c] >= _rationalPosInfty)
            solver.changeUpper(c, realParam(SoPlexBase<R>::INFTY));
         else
            solver.changeUpper(c, T(_modUpper[c]));
      }
   }
}